

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

bool __thiscall cmFileListGeneratorBase::Search(cmFileListGeneratorBase *this,cmFileList *listing)

{
  int iVar1;
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
  iVar1 = (*this->_vptr_cmFileListGeneratorBase[2])(this,(string *)local_40,listing);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return SUB41(iVar1,0);
}

Assistant:

bool cmFileListGeneratorBase::Search(cmFileList& listing)
{
  return this->Search("", listing);
}